

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O2

string * __thiscall
iDynTree::SixAxisForceTorqueSensor::toString_abi_cxx11_
          (string *__return_storage_ptr__,SixAxisForceTorqueSensor *this,Model *param_1)

{
  ostream *poVar1;
  stringstream ss;
  string sStack_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Sensor ");
  (*(this->super_JointSensor).super_Sensor._vptr_Sensor[2])(&sStack_1e8,this);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_1e8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  poVar1 = std::operator<<(local_198," is attached to joint ");
  (*(this->super_JointSensor).super_Sensor._vptr_Sensor[9])(&sStack_1e8,this);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_1e8);
  poVar1 = std::operator<<(poVar1," ( ");
  (*(this->super_JointSensor).super_Sensor._vptr_Sensor[10])(this);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," ) ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  poVar1 = std::operator<<(local_198," that connects  ");
  getFirstLinkName_abi_cxx11_(&sStack_1e8,this);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_1e8);
  poVar1 = std::operator<<(poVar1," ( ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," ) and ");
  getSecondLinkName_abi_cxx11_(&local_1c8,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1," ( ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string SixAxisForceTorqueSensor::toString(const Model&  /*model*/) const
{
    std::stringstream ss;

    ss << "Sensor " << this->getName() << std::endl;
    ss << " is attached to joint " << this->getParentJoint() << " ( " << this->getParentJointIndex() << " ) " << std::endl;
    ss << " that connects  " << this->getFirstLinkName() << " ( " << this->getFirstLinkIndex() << " ) and "
                             << this->getSecondLinkName() << " ( " << this->getSecondLinkIndex() << std::endl;

    return ss.str();
}